

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

void __thiscall
HighsPrimalHeuristics::RINS
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *relaxationsol)

{
  int64_t *piVar1;
  double *pdVar2;
  int col;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  const_iterator __last;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  int64_t iVar8;
  long lVar9;
  long lVar10;
  const_iterator cVar11;
  long lVar12;
  long lVar13;
  HighsInt col_00;
  pair<int,_double> *fracvar;
  pair<int,_double> *ppVar14;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  begin;
  ulong uVar15;
  pointer this_00;
  size_t sVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  anon_class_16_2_405d1b53 comp;
  undefined1 in_stack_ffffffffffffa588;
  bool fixtolpsol;
  double local_5a60;
  double local_5a58;
  int local_5a4c;
  double local_5a48;
  vector<double,_std::allocator<double>_> *local_5a40;
  double local_5a38;
  double local_5a20;
  anon_class_32_4_ffb23deb getFixVal;
  _Vector_base<double,_std::allocator<double>_> local_59f8;
  _Vector_base<double,_std::allocator<double>_> local_59e0;
  HighsSearch heur;
  HeuristicNeighbourhood neighbourhood;
  HighsPseudocost pscost;
  HighsLpRelaxation heurlp;
  
  _Var3._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if (*(bool *)((long)&(_Var3._M_head_impl)->domain + 0x280) != false) {
    return;
  }
  if ((long)(relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)this->mipsolver->model_->num_col_) {
    return;
  }
  piVar7 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  lVar13 = (long)__last._M_current - (long)piVar7;
  for (lVar10 = lVar13 >> 4; 0 < lVar10; lVar10 = lVar10 + -1) {
    lVar9 = *(long *)&((vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var3._M_head_impl)->domain + 0x308))->
                      super__Vector_base<double,_std::allocator<double>_>;
    lVar12 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var3._M_head_impl)->domain + 800))->
                       super__Vector_base<double,_std::allocator<double>_>;
    dVar18 = *(double *)(lVar9 + (long)*piVar7 * 8);
    pdVar2 = (double *)(lVar12 + (long)*piVar7 * 8);
    if ((dVar18 == *pdVar2) && (!NAN(dVar18) && !NAN(*pdVar2))) goto LAB_002da9d5;
    dVar18 = *(double *)(lVar9 + (long)piVar7[1] * 8);
    pdVar2 = (double *)(lVar12 + (long)piVar7[1] * 8);
    if ((dVar18 == *pdVar2) && (!NAN(dVar18) && !NAN(*pdVar2))) {
      piVar7 = piVar7 + 1;
      goto LAB_002da9d5;
    }
    dVar18 = *(double *)(lVar9 + (long)piVar7[2] * 8);
    pdVar2 = (double *)(lVar12 + (long)piVar7[2] * 8);
    if ((dVar18 == *pdVar2) && (!NAN(dVar18) && !NAN(*pdVar2))) {
      piVar7 = piVar7 + 2;
      goto LAB_002da9d5;
    }
    dVar18 = *(double *)(lVar9 + (long)piVar7[3] * 8);
    pdVar2 = (double *)(lVar12 + (long)piVar7[3] * 8);
    if ((dVar18 == *pdVar2) && (!NAN(dVar18) && !NAN(*pdVar2))) {
      piVar7 = piVar7 + 3;
      goto LAB_002da9d5;
    }
    piVar7 = piVar7 + 4;
    lVar13 = lVar13 + -0x10;
  }
  lVar13 = lVar13 >> 2;
  cVar11._M_current = __last._M_current;
  if (lVar13 == 3) {
    lVar9 = *(long *)&((vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var3._M_head_impl)->domain + 0x308))->
                      super__Vector_base<double,_std::allocator<double>_>;
    lVar12 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var3._M_head_impl)->domain + 800))->
                       super__Vector_base<double,_std::allocator<double>_>;
    dVar18 = *(double *)(lVar9 + (long)*piVar7 * 8);
    pdVar2 = (double *)(lVar12 + (long)*piVar7 * 8);
    if ((dVar18 != *pdVar2) || (NAN(dVar18) || NAN(*pdVar2))) {
      piVar7 = piVar7 + 1;
      goto LAB_002da9aa;
    }
  }
  else {
    if (lVar13 == 2) {
      lVar9 = *(long *)&((vector<double,_std::allocator<double>_> *)
                        ((long)&(_Var3._M_head_impl)->domain + 0x308))->
                        super__Vector_base<double,_std::allocator<double>_>;
      lVar12 = *(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var3._M_head_impl)->domain + 800))->
                         super__Vector_base<double,_std::allocator<double>_>;
LAB_002da9aa:
      dVar18 = *(double *)(lVar9 + (long)*piVar7 * 8);
      pdVar2 = (double *)(lVar12 + (long)*piVar7 * 8);
      if ((dVar18 == *pdVar2) && (!NAN(dVar18) && !NAN(*pdVar2))) goto LAB_002da9d5;
      piVar7 = piVar7 + 1;
    }
    else {
      if (lVar13 != 1) goto LAB_002daa0d;
      lVar9 = *(long *)&((vector<double,_std::allocator<double>_> *)
                        ((long)&(_Var3._M_head_impl)->domain + 0x308))->
                        super__Vector_base<double,_std::allocator<double>_>;
      lVar12 = *(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var3._M_head_impl)->domain + 800))->
                         super__Vector_base<double,_std::allocator<double>_>;
    }
    dVar18 = *(double *)(lVar9 + (long)*piVar7 * 8);
    pdVar2 = (double *)(lVar12 + (long)*piVar7 * 8);
    if ((dVar18 != *pdVar2) || (NAN(dVar18) || NAN(*pdVar2))) goto LAB_002daa0d;
  }
LAB_002da9d5:
  cVar11._M_current = piVar7;
  if (piVar7 != __last._M_current) {
    while (piVar7 = piVar7 + 1, piVar7 != __last._M_current) {
      iVar6 = *piVar7;
      dVar18 = *(double *)(lVar9 + (long)iVar6 * 8);
      pdVar2 = (double *)(lVar12 + (long)iVar6 * 8);
      if ((dVar18 != *pdVar2) || (NAN(dVar18) || NAN(*pdVar2))) {
        *cVar11._M_current = iVar6;
        cVar11._M_current = cVar11._M_current + 1;
      }
    }
  }
LAB_002daa0d:
  std::vector<int,_std::allocator<int>_>::erase(&this->intcols,cVar11,__last);
  HighsPseudocost::HighsPseudocost
            (&pscost,&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost
            );
  HighsSearch::HighsSearch(&heur,this->mipsolver,&pscost);
  heur.inheuristic = true;
  heur.childselrule = kHybridInferenceCost;
  HighsLpRelaxation::HighsLpRelaxation
            (&heurlp,&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp);
  HighsLpRelaxation::setObjectiveLimit
            (&heurlp,((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit
            );
  heurlp.adjustSymBranchingCol = false;
  heur.lp = &heurlp;
  Highs::changeColsBounds
            (&heurlp.lpsolver,0,this->mipsolver->model_->num_col_ + -1,
             heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  HighsDomain::clearChangedCols(&heur.localdom);
  HighsSearch::createNewNode(&heur);
  local_5a60 = determineTargetFixingRate(this);
  local_5a40 = relaxationsol;
  HeuristicNeighbourhood::HeuristicNeighbourhood(&neighbourhood,this->mipsolver,&heur.localdom);
  local_5a4c = -1;
  uVar15 = 1;
LAB_002dab3a:
  HeuristicNeighbourhood::backtracked(&neighbourhood);
  local_5a4c = local_5a4c + 1;
  if (((int)(((long)heur.nodestack.
                    super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)heur.nodestack.
                   super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60) + heur.depthoffset <=
       (HighsInt)uVar15) ||
     (bVar5 = HighsSearch::backtrackUntilDepth(&heur,(HighsInt)uVar15), bVar5)) {
LAB_002dab82:
    while (HighsSearch::evaluateNode(&heur),
          heur.nodestack.
          super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].opensubtrees == '\0') {
      if (*(bool *)((long)&((this->mipsolver->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                           domain + 0x280) == true) {
        lVar10 = HighsSearch::getLocalLpIterations(&heur);
        goto LAB_002db345;
      }
      bVar5 = HighsSearch::backtrack(&heur,true);
      local_5a4c = local_5a4c + 1;
      if (!bVar5) goto LAB_002db0e0;
      HeuristicNeighbourhood::backtracked(&neighbourhood);
    }
    local_5a58 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    this_00 = heurlp.fractionalints.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((local_5a60 <= local_5a58) || (9 < local_5a4c)) goto LAB_002db0e0;
    getFixVal.fixtolpsol = (bool *)local_5a40;
    fracvar = heurlp.fractionalints.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    getFixVal.relaxationsol = (vector<double,_std::allocator<double>_> *)this;
    for (begin._M_current =
              heurlp.fractionalints.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start; begin._M_current != fracvar;
        begin._M_current = begin._M_current + 1) {
      bVar5 = RINS::anon_class_16_2_56b3b2aa::operator()
                        ((anon_class_16_2_56b3b2aa *)&getFixVal,begin._M_current);
      if (!bVar5) {
        do {
          ppVar14 = fracvar;
          fracvar = ppVar14 + -1;
          if (fracvar == begin._M_current) goto LAB_002dac47;
          bVar5 = RINS::anon_class_16_2_56b3b2aa::operator()
                            ((anon_class_16_2_56b3b2aa *)&getFixVal,fracvar);
        } while (!bVar5);
        iVar6 = (begin._M_current)->first;
        (begin._M_current)->first = fracvar->first;
        fracvar->first = iVar6;
        dVar18 = (begin._M_current)->second;
        (begin._M_current)->second = ppVar14[-1].second;
        ppVar14[-1].second = dVar18;
      }
    }
LAB_002dac47:
    fixtolpsol = true;
    getFixVal.fixtolpsol = &fixtolpsol;
    getFixVal.relaxationsol = local_5a40;
    getFixVal.localdom = &heur.localdom;
    getFixVal.this = this;
    if (begin._M_current == this_00) {
      local_5a58 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
      local_5a48 = (1.0 - local_5a58) * -0.9 + 1.0;
      if (local_5a60 <= local_5a48) {
        local_5a48 = local_5a60;
      }
      piVar4 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar6 = 0;
      for (piVar7 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar7 != piVar4; piVar7 = piVar7 + 1) {
        col = *piVar7;
        lVar10 = (long)col;
        dVar18 = heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar10];
        dVar19 = heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar10];
        if (((dVar18 != dVar19) || (NAN(dVar18) || NAN(dVar19))) &&
           (dVar17 = heurlp.lpsolver.solution_.col_value.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10],
           _Var3._M_head_impl =
                (this->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
           ABS(dVar17 - *(double *)
                         (*(long *)&((_Var3._M_head_impl)->incumbent).
                                    super__Vector_base<double,_std::allocator<double>_> + lVar10 * 8
                         )) <= (_Var3._M_head_impl)->feastol)) {
          dVar17 = (double)(long)((double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000)
                                 + dVar17);
          if (dVar18 < dVar17) {
            local_5a38 = dVar17;
            HighsSearch::branchUpwards(&heur,col,dVar17,dVar17 + -0.5);
            HighsDomain::propagate(&heur.localdom);
            iVar6 = iVar6 + 1;
            if (heur.localdom.infeasible_ == true) {
              HighsDomain::conflictAnalysis
                        (&heur.localdom,
                         &((this->mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          conflictPool);
              break;
            }
            local_5a58 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
            dVar19 = heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar10];
            dVar17 = local_5a38;
          }
          if (dVar17 < dVar19) {
            HighsSearch::branchDownwards(&heur,col,dVar17,dVar17 + 0.5);
            HighsDomain::propagate(&heur.localdom);
            iVar6 = iVar6 + 1;
            if (heur.localdom.infeasible_ == true) {
              HighsDomain::conflictAnalysis
                        (&heur.localdom,
                         &((this->mipsolver->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          conflictPool);
              break;
            }
            local_5a58 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
          }
          if (local_5a48 <= local_5a58) break;
        }
      }
      if (iVar6 != 0) {
        HighsLpRelaxation::flushDomain(&heurlp,&heur.localdom,false);
        goto LAB_002dab82;
      }
      if (0.25 <= local_5a58) goto LAB_002db0e0;
      fixtolpsol = false;
      begin._M_current =
           heurlp.fractionalints.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      this_00 = heurlp.fractionalints.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (this_00 != begin._M_current) {
      iVar6 = pdqsort_detail::log2<long>((long)begin._M_current - (long)this_00 >> 4);
      comp.heurlp._0_4_ = iVar6;
      comp.getFixVal = (anon_class_32_4_ffb23deb *)&heurlp;
      comp.heurlp._4_4_ = 0;
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
                ((pdqsort_detail *)this_00,begin,(pair<int,_double> *)&getFixVal,comp,1,
                 (bool)in_stack_ffffffffffffa588);
      this_00 = heurlp.fractionalints.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    dVar18 = 0.0;
    iVar6 = 0;
    do {
      if (this_00 == begin._M_current) break;
      col_00 = this_00->first;
      local_5a20 = this_00->second;
      local_5a48 = dVar18;
      local_5a38 = RINS::anon_class_32_4_ffb23deb::operator()(&getFixVal,col_00,local_5a20);
      lVar10 = (long)col_00;
      if (heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] <= local_5a38 &&
          local_5a38 !=
          heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10]) {
        HighsSearch::branchUpwards(&heur,col_00,local_5a38,local_5a20);
        iVar6 = iVar6 + 1;
        if (heur.localdom.infeasible_ == true) {
          HighsDomain::conflictAnalysis
                    (&heur.localdom,
                     &((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                      conflictPool);
          break;
        }
        local_5a58 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
        col_00 = this_00->first;
        lVar10 = (long)col_00;
      }
      if (local_5a38 <
          heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10]) {
        HighsSearch::branchDownwards(&heur,col_00,local_5a38,this_00->second);
        iVar6 = iVar6 + 1;
        if (heur.localdom.infeasible_ == true) {
          HighsDomain::conflictAnalysis
                    (&heur.localdom,
                     &((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                      conflictPool);
          break;
        }
        local_5a58 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
      }
      if (local_5a60 <= local_5a58) break;
      dVar18 = local_5a48 + ABS(local_5a38 - this_00->second);
      this_00 = this_00 + 1;
    } while (dVar18 < 0.5);
    if (iVar6 == 0) goto LAB_002db0e0;
    HighsLpRelaxation::flushDomain(&heurlp,&heur.localdom,false);
    goto LAB_002dab82;
  }
  lVar10 = HighsSearch::getLocalLpIterations(&heur);
  goto LAB_002db345;
LAB_002db0e0:
  if (heur.nodestack.
      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
      super__Vector_impl_data._M_start ==
      heur.nodestack.
      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar10 = HighsSearch::getLocalLpIterations(&heur);
  }
  else {
    local_5a60 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if ((local_5a60 < 0.1) ||
       ((this->mipsolver->submip == true &&
        (((this->mipsolver->mipdata_)._M_t.
          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
          super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numImprovingSols != 0)))
       ) {
      HighsSearch::setMinReliable(&heur,0);
      HighsSearch::solveDepthFirst(&heur,10);
      iVar8 = HighsSearch::getLocalLpIterations(&heur);
      this->lp_iterations = this->lp_iterations + iVar8;
      if (this->mipsolver->submip == true) {
        iVar8 = HighsSearch::getLocalNodes(&heur);
        piVar1 = &((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes;
        *piVar1 = *piVar1 + iVar8;
      }
      goto LAB_002db34e;
    }
    HighsLpRelaxation::removeObsoleteRows(&heurlp,false);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_59f8,&heur.localdom.col_lower_);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_59e0,&heur.localdom.col_upper_);
    bVar5 = solveSubMip(this,&heurlp.lpsolver.model_.lp_,&heurlp.lpsolver.basis_,local_5a60,
                        (vector<double,_std::allocator<double>_> *)&local_59f8,
                        (vector<double,_std::allocator<double>_> *)&local_59e0,500,
                        (int)(((this->mipsolver->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                              num_nodes / 0x14) + 200,0xc);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_59e0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_59f8);
    if (!bVar5) {
      sVar16 = this->lp_iterations;
      iVar8 = HighsSearch::getLocalLpIterations(&heur);
      sVar16 = iVar8 + sVar16;
      _Var3._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if ((((_Var3._M_head_impl)->total_lp_iterations -
            ((_Var3._M_head_impl)->heuristic_lp_iterations + (_Var3._M_head_impl)->sb_lp_iterations)
           >> 1) + 100000 < (long)((_Var3._M_head_impl)->heuristic_lp_iterations + sVar16)) ||
         (iVar6 = (int)(((long)heur.nodestack.
                               super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)heur.nodestack.
                              super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x60) + heur.depthoffset,
         iVar6 < 4)) {
LAB_002db297:
        this->lp_iterations = sVar16;
LAB_002db34e:
        HighsHashTable<int,_void>::~HighsHashTable(&neighbourhood.fixedCols);
        HighsLpRelaxation::~HighsLpRelaxation(&heurlp);
        HighsSearch::~HighsSearch(&heur);
        HighsPseudocost::~HighsPseudocost(&pscost);
        return;
      }
      uVar15 = (long)iVar6 / 2 & 0xffffffff;
      bVar5 = HighsMipSolverData::checkLimits(_Var3._M_head_impl,0);
      if (bVar5) goto LAB_002db297;
      local_5a60 = local_5a60 * 0.5;
      goto LAB_002dab3a;
    }
    lVar10 = HighsSearch::getLocalLpIterations(&heur);
  }
LAB_002db345:
  this->lp_iterations = this->lp_iterations + lVar10;
  goto LAB_002db34e;
}

Assistant:

void HighsPrimalHeuristics::RINS(const std::vector<double>& relaxationsol) {
  // return if domain is infeasible
  if (mipsolver.mipdata_->domain.infeasible()) return;

  if (relaxationsol.size() != static_cast<size_t>(mipsolver.numCol())) return;

  intcols.erase(std::remove_if(intcols.begin(), intcols.end(),
                               [&](HighsInt i) {
                                 return mipsolver.mipdata_->domain.isFixed(i);
                               }),
                intcols.end());

  HighsPseudocost pscost(mipsolver.mipdata_->pseudocost);
  HighsSearch heur(mipsolver, pscost);
  HighsDomain& localdom = heur.getLocalDomain();
  heur.setHeuristic(true);

  HighsLpRelaxation heurlp(mipsolver.mipdata_->lp);
  // only use the global upper limit as LP limit so that dual proofs are valid
  heurlp.setObjectiveLimit(mipsolver.mipdata_->upper_limit);
  heurlp.setAdjustSymmetricBranchingCol(false);
  heur.setLpRelaxation(&heurlp);

  heurlp.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                        localdom.col_lower_.data(),
                                        localdom.col_upper_.data());
  localdom.clearChangedCols();
  heur.createNewNode();

  // determine the initial number of unfixed variables fixing rate to decide if
  // the problem is restricted enough to be considered for solving a submip
  double maxfixingrate = determineTargetFixingRate();
  double minfixingrate = 0.25;
  double fixingrate = 0.0;
  bool stop = false;
  HighsInt nbacktracks = -1;
  HighsInt targetdepth = 1;
  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);
retry:
  ++nbacktracks;
  neighbourhood.backtracked();
  // printf("current depth : %" HIGHSINT_FORMAT "   target depth : %"
  // HIGHSINT_FORMAT "\n", heur.getCurrentDepth(),
  //       targetdepth);
  if (heur.getCurrentDepth() > targetdepth) {
    if (!heur.backtrackUntilDepth(targetdepth)) {
      lp_iterations += heur.getLocalLpIterations();
      return;
    }
  }

  assert(heur.hasNode());

  while (true) {
    heur.evaluateNode();
    if (heur.currentNodePruned()) {
      ++nbacktracks;
      // printf("backtrack1\n");
      if (mipsolver.mipdata_->domain.infeasible()) {
        lp_iterations += heur.getLocalLpIterations();
        return;
      }

      if (!heur.backtrack()) break;
      neighbourhood.backtracked();
      continue;
    }

    fixingrate = neighbourhood.getFixingRate();

    if (stop) break;
    if (fixingrate >= maxfixingrate) break;
    if (nbacktracks >= 10) break;

    std::vector<std::pair<HighsInt, double>>::iterator fixcandend;

    // partition the fractional variables to consider which ones should we fix
    // in this dive first if there is an incumbent, we dive towards the RINS
    // neighbourhood
    fixcandend = std::partition(
        heurlp.getFractionalIntegers().begin(),
        heurlp.getFractionalIntegers().end(),
        [&](const std::pair<HighsInt, double>& fracvar) {
          return std::abs(relaxationsol[fracvar.first] -
                          mipsolver.mipdata_->incumbent[fracvar.first]) <=
                 mipsolver.mipdata_->feastol;
        });

    bool fixtolpsol = true;

    auto getFixVal = [&](HighsInt col, double fracval) {
      double fixval;
      if (fixtolpsol) {
        // RINS neighbourhood (with extension)
        fixval = std::floor(relaxationsol[col] + 0.5);
      } else {
        // reinforce direction of this solution away from root
        // solution if the change is at least 0.4
        // otherwise take the direction where the objective gets worse
        // if objective is zero round to nearest integer
        double rootchange = fracval - mipsolver.mipdata_->rootlpsol[col];
        if (rootchange >= 0.4)
          fixval = std::ceil(fracval);
        else if (rootchange <= -0.4)
          fixval = std::floor(fracval);
        if (mipsolver.model_->col_cost_[col] > 0.0)
          fixval = std::ceil(fracval);
        else if (mipsolver.model_->col_cost_[col] < 0.0)
          fixval = std::floor(fracval);
        else
          fixval = std::floor(fracval + 0.5);
      }
      // make sure we do not set an infeasible domain
      fixval = std::min(localdom.col_upper_[col], fixval);
      fixval = std::max(localdom.col_lower_[col], fixval);
      return fixval;
    };

    // no candidates left to fix for getting to the neighbourhood, therefore we
    // switch to a different diving strategy until the minimal fixing rate is
    // reached
    HighsInt numBranched = 0;
    if (heurlp.getFractionalIntegers().begin() == fixcandend) {
      fixingrate = neighbourhood.getFixingRate();
      double stopFixingRate =
          std::min(maxfixingrate, 1.0 - (1.0 - fixingrate) * 0.9);
      const auto& currlpsol = heurlp.getSolution().col_value;
      for (HighsInt i : intcols) {
        if (localdom.col_lower_[i] == localdom.col_upper_[i]) continue;

        if (std::abs(currlpsol[i] - mipsolver.mipdata_->incumbent[i]) <=
            mipsolver.mipdata_->feastol) {
          double fixval = HighsIntegers::nearestInteger(currlpsol[i]);
          if (localdom.col_lower_[i] < fixval) {
            ++numBranched;
            heur.branchUpwards(i, fixval, fixval - 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }
          if (localdom.col_upper_[i] > fixval) {
            ++numBranched;
            heur.branchDownwards(i, fixval, fixval + 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }

          if (fixingrate >= stopFixingRate) break;
        }
      }

      if (numBranched != 0) {
        // printf(
        //    "fixed %" HIGHSINT_FORMAT " additional cols, old fixing rate:
        //    %.2f%%, new fixing " "rate: %.2f%%\n", numBranched, fixingrate,
        //    getFixingRate());
        heurlp.flushDomain(localdom);
        continue;
      }

      if (fixingrate >= minfixingrate)
        break;  // if the RINS neighbourhood achieved a high enough fixing rate
                // by itself we stop here
      fixcandend = heurlp.getFractionalIntegers().end();
      // now sort the variables by their distance towards the value they will
      // be fixed to
      fixtolpsol = false;
    }

    // now sort the variables by their distance towards the value they will be
    // fixed to
    pdqsort(heurlp.getFractionalIntegers().begin(), fixcandend,
            [&](const std::pair<HighsInt, double>& a,
                const std::pair<HighsInt, double>& b) {
              return std::make_pair(
                         std::abs(getFixVal(a.first, a.second) - a.second),
                         HighsHashHelpers::hash(
                             (uint64_t(a.first) << 32) +
                             heurlp.getFractionalIntegers().size())) <
                     std::make_pair(
                         std::abs(getFixVal(b.first, b.second) - b.second),
                         HighsHashHelpers::hash(
                             (uint64_t(b.first) << 32) +
                             heurlp.getFractionalIntegers().size()));
            });

    double change = 0.0;
    // select a set of fractional variables to fix
    for (auto fracint = heurlp.getFractionalIntegers().begin();
         fracint != fixcandend; ++fracint) {
      double fixval = getFixVal(fracint->first, fracint->second);

      if (localdom.col_lower_[fracint->first] < fixval) {
        ++numBranched;
        heur.branchUpwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (localdom.col_upper_[fracint->first] > fixval) {
        ++numBranched;
        heur.branchDownwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (fixingrate >= maxfixingrate) break;

      change += std::abs(fixval - fracint->second);
      if (change >= 0.5) break;
    }

    if (numBranched == 0) break;

    heurlp.flushDomain(localdom);

    // printf("%" HIGHSINT_FORMAT "/%" HIGHSINT_FORMAT " fixed, fixingrate is
    // %g\n", nfixed, ntotal, fixingrate);
  }

  // if there is no node left it means we backtracked to the global domain and
  // the subproblem was solved with the dive
  if (!heur.hasNode()) {
    lp_iterations += heur.getLocalLpIterations();
    return;
  }
  // determine the fixing rate to decide if the problem is restricted enough
  // to be considered for solving a submip

  // printf("fixing rate is %g\n", fixingrate);
  fixingrate = neighbourhood.getFixingRate();
  if (fixingrate < 0.1 ||
      (mipsolver.submip && mipsolver.mipdata_->numImprovingSols != 0)) {
    // heur.childselrule = ChildSelectionRule::kBestCost;
    heur.setMinReliable(0);
    heur.solveDepthFirst(10);
    lp_iterations += heur.getLocalLpIterations();
    if (mipsolver.submip) mipsolver.mipdata_->num_nodes += heur.getLocalNodes();
    // lpiterations += heur.lpiterations;
    // pseudocost = heur.pseudocost;
    return;
  }

  heurlp.removeObsoleteRows(false);
  const bool solve_sub_mip_return =
      solveSubMip(heurlp.getLp(), heurlp.getLpSolver().getBasis(), fixingrate,
                  localdom.col_lower_, localdom.col_upper_,
                  500,  // std::max(50, int(0.05 *
                  // (mipsolver.mipdata_->num_leaves))),
                  200 + mipsolver.mipdata_->num_nodes / 20, 12);
  if (!solve_sub_mip_return) {
    int64_t new_lp_iterations = lp_iterations + heur.getLocalLpIterations();
    if (new_lp_iterations + mipsolver.mipdata_->heuristic_lp_iterations >
        100000 + ((mipsolver.mipdata_->total_lp_iterations -
                   mipsolver.mipdata_->heuristic_lp_iterations -
                   mipsolver.mipdata_->sb_lp_iterations) >>
                  1)) {
      lp_iterations = new_lp_iterations;
      return;
    }

    targetdepth = heur.getCurrentDepth() / 2;
    if (targetdepth <= 1 || mipsolver.mipdata_->checkLimits()) {
      lp_iterations = new_lp_iterations;
      return;
    }
    // printf("infeasible in root node, trying with lower fixing rate\n");
    maxfixingrate = fixingrate * 0.5;
    goto retry;
  }

  lp_iterations += heur.getLocalLpIterations();
}